

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cpp
# Opt level: O2

int __thiscall
ncnn::GRU::forward(GRU *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint _h;
  int iVar1;
  Mat *bottom_blob;
  Allocator *_allocator;
  Mat *this_00;
  pointer pMVar2;
  int *piVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  size_t sVar7;
  ulong uVar8;
  void *__src;
  void *__dest;
  bool bVar9;
  Mat local_288;
  Mat m;
  Mat m_1;
  Mat m_5;
  Mat m_4;
  Mat m_3;
  Mat m_2;
  Mat m_8;
  
  bottom_blob = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
  _h = bottom_blob->h;
  iVar1 = this->direction;
  local_288.cstep = 0;
  local_288.data = (void *)0x0;
  local_288.refcount._0_4_ = 0;
  local_288.refcount._4_4_ = 0;
  local_288.elemsize._0_4_ = 0;
  local_288.elemsize._4_4_ = 0;
  local_288.elempack = 0;
  local_288.allocator = (Allocator *)0x0;
  local_288.dims = 0;
  local_288.w = 0;
  local_288.h = 0;
  local_288.d = 0;
  local_288.c = 0;
  _allocator = (&opt->blob_allocator)
               [(long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish -
                (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start != 0x90];
  iVar4 = -100;
  if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)bottom_blob == 0x90) {
    Mat::clone(&m,(__fn *)(bottom_blob + 1),_allocator,0x90,_allocator);
    piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_288.allocator == (Allocator *)0x0) {
          free(local_288.data);
        }
        else {
          (*(local_288.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    local_288.data = m.data;
    local_288.refcount._0_4_ = m.refcount._0_4_;
    local_288.refcount._4_4_ = m.refcount._4_4_;
    local_288.elemsize._0_4_ = (undefined4)m.elemsize;
    local_288.elemsize._4_4_ = m.elemsize._4_4_;
    local_288.elempack = m.elempack;
    local_288.allocator = m.allocator;
    local_288.dims = m.dims;
    local_288.w = m.w;
    local_288.h = m.h;
    local_288.d = m.d;
    local_288.c = m.c;
    local_288.cstep = m.cstep;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          free(m.data);
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    Mat::create(&local_288,this->num_output,(iVar1 == 2) + 1,4,_allocator);
    if ((local_288.data == (void *)0x0) || (local_288.cstep * (long)local_288.c == 0))
    goto LAB_0049e02b;
    uVar6 = (int)local_288.cstep * local_288.c;
    uVar8 = 0;
    uVar5 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar5 = uVar8;
    }
    for (; (int)uVar5 != (int)uVar8; uVar8 = uVar8 + 1) {
      *(undefined4 *)((long)local_288.data + uVar8 * 4) = 0;
    }
  }
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,this->num_output << (iVar1 == 2),_h,4,opt->blob_allocator);
  if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0)) goto LAB_0049e02b;
  uVar6 = this->direction;
  if (uVar6 < 2) {
    m.w = (this->weight_xc_data).w;
    m.h = (this->weight_xc_data).h;
    m.data = (this->weight_xc_data).data;
    uVar5 = (this->weight_xc_data).elemsize;
    m.elempack = (this->weight_xc_data).elempack;
    m.allocator = (this->weight_xc_data).allocator;
    m.refcount._0_4_ = 0;
    m.refcount._4_4_ = 0;
    m.elemsize._0_4_ = (undefined4)uVar5;
    m.elemsize._4_4_ = (undefined4)(uVar5 >> 0x20);
    m.c = (this->weight_xc_data).d;
    m.d = 1;
    iVar1 = (this->weight_xc_data).dims;
    m.dims = iVar1 + -1;
    m.cstep = (uVar5 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar5;
    if (iVar1 == 4) {
      m.cstep = (long)m.h * (long)m.w;
    }
    m_1.w = (this->bias_c_data).w;
    m_1.h = (this->bias_c_data).h;
    m_1.data = (this->bias_c_data).data;
    uVar5 = (this->bias_c_data).elemsize;
    m_1.elempack = (this->bias_c_data).elempack;
    m_1.allocator = (this->bias_c_data).allocator;
    m_1.refcount._0_4_ = 0;
    m_1.refcount._4_4_ = 0;
    m_1.elemsize._0_4_ = (undefined4)uVar5;
    m_1.elemsize._4_4_ = (undefined4)(uVar5 >> 0x20);
    m_1.c = (this->bias_c_data).d;
    m_1.d = 1;
    iVar1 = (this->bias_c_data).dims;
    m_1.dims = iVar1 + -1;
    m_1.cstep = (uVar5 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) / uVar5;
    if (iVar1 == 4) {
      m_1.cstep = (long)m_1.h * (long)m_1.w;
    }
    m_2.w = (this->weight_hc_data).w;
    m_2.h = (this->weight_hc_data).h;
    m_2.c = (this->weight_hc_data).d;
    m_2.data = (this->weight_hc_data).data;
    m_2.elemsize = (this->weight_hc_data).elemsize;
    m_2.elempack = (this->weight_hc_data).elempack;
    m_2.allocator = (this->weight_hc_data).allocator;
    m_2.refcount = (int *)0x0;
    m_2.d = 1;
    sVar7 = (long)m_2.h * (long)m_2.w;
    iVar1 = (this->weight_hc_data).dims;
    m_2.dims = iVar1 + -1;
    m_2.cstep = (m_2.elemsize * sVar7 + 0xf & 0xfffffffffffffff0) / m_2.elemsize;
    if (iVar1 == 4) {
      m_2.cstep = sVar7;
    }
    iVar4 = gru(bottom_blob,this_00,uVar6,&m,&m_1,&m_2,&local_288,opt);
    if (iVar4 != 0) goto LAB_0049e02b;
    uVar6 = this->direction;
  }
  if (uVar6 == 2) {
    m.cstep = 0;
    m.data = (void *)0x0;
    m.refcount._0_4_ = 0;
    m.refcount._4_4_ = 0;
    m.elemsize._0_4_ = 0;
    m.elemsize._4_4_ = 0;
    m.elempack = 0;
    m.allocator = (Allocator *)0x0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
    Mat::create(&m,this->num_output,_h,4,opt->workspace_allocator);
    iVar4 = -100;
    if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
      bVar9 = false;
    }
    else {
      m_1.cstep = 0;
      m_1.data = (void *)0x0;
      m_1.refcount._0_4_ = 0;
      m_1.refcount._4_4_ = 0;
      m_1.elemsize._0_4_ = 0;
      m_1.elemsize._4_4_ = 0;
      m_1.elempack = 0;
      m_1.allocator = (Allocator *)0x0;
      m_1.dims = 0;
      m_1.w = 0;
      m_1.h = 0;
      m_1.d = 0;
      m_1.c = 0;
      Mat::create(&m_1,this->num_output,_h,4,opt->workspace_allocator);
      iVar4 = -100;
      if ((m_1.data == (void *)0x0) || ((long)m_1.c * m_1.cstep == 0)) {
LAB_0049db4b:
        bVar9 = false;
      }
      else {
        m_2.cstep = (size_t)local_288.w;
        m_2.elemsize = CONCAT44(local_288.elemsize._4_4_,(undefined4)local_288.elemsize);
        m_2.data = local_288.data;
        m_2.refcount = (int *)0x0;
        m_2.elempack = local_288.elempack;
        m_2.allocator = local_288.allocator;
        m_2.dims = 2;
        m_2.w = local_288.w;
        m_2.h = 1;
        m_2.d = 1;
        m_2.c = 1;
        m_3.w = (this->weight_xc_data).w;
        m_3.h = (this->weight_xc_data).h;
        m_3.c = (this->weight_xc_data).d;
        m_3.data = (this->weight_xc_data).data;
        m_3.elemsize = (this->weight_xc_data).elemsize;
        m_3.elempack = (this->weight_xc_data).elempack;
        m_3.allocator = (this->weight_xc_data).allocator;
        m_3.refcount = (int *)0x0;
        m_3.d = 1;
        sVar7 = (long)m_3.h * (long)m_3.w;
        iVar1 = (this->weight_xc_data).dims;
        m_3.dims = iVar1 + -1;
        m_3.cstep = (m_3.elemsize * sVar7 + 0xf & 0xfffffffffffffff0) / m_3.elemsize;
        if (iVar1 == 4) {
          m_3.cstep = sVar7;
        }
        m_4.w = (this->bias_c_data).w;
        m_4.h = (this->bias_c_data).h;
        m_4.c = (this->bias_c_data).d;
        m_4.data = (this->bias_c_data).data;
        m_4.elemsize = (this->bias_c_data).elemsize;
        m_4.elempack = (this->bias_c_data).elempack;
        m_4.allocator = (this->bias_c_data).allocator;
        m_4.refcount = (int *)0x0;
        m_4.d = 1;
        iVar1 = (this->bias_c_data).dims;
        m_4.dims = iVar1 + -1;
        m_4.cstep = (m_4.elemsize * (long)m_4.h * (long)m_4.w + 0xf & 0xfffffffffffffff0) /
                    m_4.elemsize;
        if (iVar1 == 4) {
          m_4.cstep = (long)m_4.h * (long)m_4.w;
        }
        m_5.w = (this->weight_hc_data).w;
        m_5.h = (this->weight_hc_data).h;
        m_5.c = (this->weight_hc_data).d;
        m_5.data = (this->weight_hc_data).data;
        m_5.elemsize = (this->weight_hc_data).elemsize;
        m_5.elempack = (this->weight_hc_data).elempack;
        m_5.allocator = (this->weight_hc_data).allocator;
        m_5.refcount = (int *)0x0;
        m_5.d = 1;
        iVar1 = (this->weight_hc_data).dims;
        m_5.dims = iVar1 + -1;
        m_5.cstep = (m_5.elemsize * (long)m_5.h * (long)m_5.w + 0xf & 0xfffffffffffffff0) /
                    m_5.elemsize;
        if (iVar1 == 4) {
          m_5.cstep = (long)m_5.h * (long)m_5.w;
        }
        iVar4 = gru(bottom_blob,&m,0,&m_3,&m_4,&m_5,&m_2,opt);
        if (iVar4 != 0) goto LAB_0049db4b;
        m_3.cstep = (size_t)local_288.w;
        m_3.elemsize = CONCAT44(local_288.elemsize._4_4_,(undefined4)local_288.elemsize);
        m_3.data = (void *)(m_3.elemsize * m_3.cstep + (long)local_288.data);
        m_3.refcount = (int *)0x0;
        m_3.elempack = local_288.elempack;
        m_3.allocator = local_288.allocator;
        m_3.dims = 2;
        m_3.w = local_288.w;
        m_3.h = 1;
        m_3.d = 1;
        m_4.d = 1;
        m_4.w = (this->weight_xc_data).w;
        m_4.h = (this->weight_xc_data).h;
        m_4.elemsize = (this->weight_xc_data).elemsize;
        m_4.data = (void *)((this->weight_xc_data).cstep * m_4.elemsize +
                           (long)(this->weight_xc_data).data);
        m_4.c = (this->weight_xc_data).d;
        m_4.elempack = (this->weight_xc_data).elempack;
        m_4.allocator = (this->weight_xc_data).allocator;
        m_4.refcount = (int *)0x0;
        iVar1 = (this->weight_xc_data).dims;
        m_4.dims = iVar1 + -1;
        m_4.cstep = (m_4.elemsize * (long)m_4.h * (long)m_4.w + 0xf & 0xfffffffffffffff0) /
                    m_4.elemsize;
        if (iVar1 == 4) {
          m_4.cstep = (long)m_4.h * (long)m_4.w;
        }
        m_5.w = (this->bias_c_data).w;
        m_5.h = (this->bias_c_data).h;
        m_5.elemsize = (this->bias_c_data).elemsize;
        m_5.data = (void *)((this->bias_c_data).cstep * m_5.elemsize +
                           (long)(this->bias_c_data).data);
        m_5.c = (this->bias_c_data).d;
        m_5.elempack = (this->bias_c_data).elempack;
        m_5.allocator = (this->bias_c_data).allocator;
        m_5.refcount = (int *)0x0;
        m_5.d = 1;
        iVar1 = (this->bias_c_data).dims;
        m_5.dims = iVar1 + -1;
        m_5.cstep = (m_5.elemsize * (long)m_5.h * (long)m_5.w + 0xf & 0xfffffffffffffff0) /
                    m_5.elemsize;
        if (iVar1 == 4) {
          m_5.cstep = (long)m_5.h * (long)m_5.w;
        }
        m_8.w = (this->weight_hc_data).w;
        m_8.h = (this->weight_hc_data).h;
        m_8.elemsize = (this->weight_hc_data).elemsize;
        m_8.data = (void *)((this->weight_hc_data).cstep * m_8.elemsize +
                           (long)(this->weight_hc_data).data);
        m_8.c = (this->weight_hc_data).d;
        m_8.elempack = (this->weight_hc_data).elempack;
        m_8.allocator = (this->weight_hc_data).allocator;
        m_8.refcount = (int *)0x0;
        m_8.d = 1;
        iVar1 = (this->weight_hc_data).dims;
        m_8.dims = iVar1 + -1;
        m_8.cstep = (m_8.elemsize * (long)m_8.h * (long)m_8.w + 0xf & 0xfffffffffffffff0) /
                    m_8.elemsize;
        if (iVar1 == 4) {
          m_8.cstep = (long)m_8.h * (long)m_8.w;
        }
        m_3.c = m_4.d;
        iVar4 = gru(bottom_blob,&m_1,1,&m_4,&m_5,&m_8,&m_3,opt);
        bVar9 = iVar4 == 0;
        if (bVar9) {
          iVar4 = 0;
          uVar5 = (ulong)_h;
          if ((int)_h < 1) {
            uVar5 = 0;
          }
          for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
            __src = (void *)((long)m_1.w * uVar8 *
                             CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize) + (long)m_1.data)
            ;
            __dest = (void *)((long)this_00->w * uVar8 * this_00->elemsize + (long)this_00->data);
            memcpy(__dest,(void *)((long)m.w * uVar8 *
                                   CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize) + (long)m.data)
                   ,(long)this->num_output << 2);
            memcpy((void *)((long)this->num_output * 4 + (long)__dest),__src,
                   (long)this->num_output << 2);
          }
        }
      }
      piVar3 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            free(m_1.data);
          }
          else {
            (*(m_1.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    piVar3 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          free(m.data);
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (!bVar9) goto LAB_0049e02b;
  }
  pMVar2 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar4 = 0;
  if (((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_finish - (long)pMVar2 == 0x90) && (pMVar2 + 1 != &local_288)
     ) {
    piVar3 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = pMVar2[1].refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (pMVar2[1].allocator == (Allocator *)0x0) {
          free(pMVar2[1].data);
        }
        else {
          (*(pMVar2[1].allocator)->_vptr_Allocator[3])();
        }
      }
    }
    pMVar2[1].data = local_288.data;
    pMVar2[1].refcount = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
    pMVar2[1].elemsize = CONCAT44(local_288.elemsize._4_4_,(undefined4)local_288.elemsize);
    pMVar2[1].elempack = local_288.elempack;
    pMVar2[1].allocator = local_288.allocator;
    pMVar2[1].dims = local_288.dims;
    pMVar2[1].w = local_288.w;
    pMVar2[1].h = local_288.h;
    pMVar2[1].d = local_288.d;
    pMVar2[1].c = local_288.c;
    pMVar2[1].cstep = local_288.cstep;
  }
LAB_0049e02b:
  piVar3 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_288.allocator == (Allocator *)0x0) {
        free(local_288.data);
      }
      else {
        (*(local_288.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar4;
}

Assistant:

int GRU::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int T = bottom_blob.h;
    int num_directions = direction == 2 ? 2 : 1;

    Mat hidden;
    Allocator* hidden_allocator = top_blobs.size() == 2 ? opt.blob_allocator : opt.workspace_allocator;
    if (bottom_blobs.size() == 2)
    {
        hidden = bottom_blobs[1].clone(hidden_allocator);
    }
    else
    {
        hidden.create(num_output, num_directions, 4u, hidden_allocator);
        if (hidden.empty())
            return -100;
        hidden.fill(0.f);
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        int ret = gru(bottom_blob, top_blob, direction, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        Mat hidden0 = hidden.row_range(0, 1);
        int ret0 = gru(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden0, opt);
        if (ret0 != 0)
            return ret0;

        Mat hidden1 = hidden.row_range(1, 1);
        int ret1 = gru(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), hidden1, opt);
        if (ret1 != 0)
            return ret1;

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    if (top_blobs.size() == 2)
    {
        top_blobs[1] = hidden;
    }

    return 0;
}